

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O1

void __thiscall
Rml::PropertySpecification::PropertySpecification
          (PropertySpecification *this,size_t reserve_num_properties,size_t reserve_num_shorthands)

{
  IdNameMap<Rml::PropertyId> *this_00;
  IdNameMap<Rml::ShorthandId> *this_01;
  pointer *__ptr;
  allocator_type local_2a;
  allocator_type local_29;
  
  ::std::
  vector<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ::vector(&this->properties,reserve_num_properties + 1,&local_29);
  ::std::
  vector<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>,_std::allocator<std::unique_ptr<Rml::ShorthandDefinition,_std::default_delete<Rml::ShorthandDefinition>_>_>_>
  ::vector(&this->shorthands,reserve_num_shorthands + 1,&local_2a);
  this_00 = (IdNameMap<Rml::PropertyId> *)operator_new(0x48);
  IdNameMap<Rml::PropertyId>::IdNameMap(this_00,reserve_num_properties + 1);
  (this->property_map)._M_t.
  super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>._M_t.
  super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>.
  super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl = (PropertyIdNameMap *)this_00
  ;
  this_01 = (IdNameMap<Rml::ShorthandId> *)operator_new(0x48);
  IdNameMap<Rml::ShorthandId>::IdNameMap(this_01,reserve_num_shorthands + 1);
  (this->shorthand_map)._M_t.
  super___uniq_ptr_impl<Rml::ShorthandIdNameMap,_std::default_delete<Rml::ShorthandIdNameMap>_>._M_t
  .super__Tuple_impl<0UL,_Rml::ShorthandIdNameMap_*,_std::default_delete<Rml::ShorthandIdNameMap>_>.
  super__Head_base<0UL,_Rml::ShorthandIdNameMap_*,_false>._M_head_impl =
       (ShorthandIdNameMap *)this_01;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->property_ids_inherited).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids_inherited).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  (this->property_ids_forcing_layout).defined_ids.super__Base_bitset<2UL>._M_w[0] = 0;
  (this->property_ids_forcing_layout).defined_ids.super__Base_bitset<2UL>._M_w[1] = 0;
  return;
}

Assistant:

PropertySpecification::PropertySpecification(size_t reserve_num_properties, size_t reserve_num_shorthands) :
	// Increment reserve numbers by one because the 'invalid' property occupies the first element
	properties(reserve_num_properties + 1), shorthands(reserve_num_shorthands + 1),
	property_map(MakeUnique<PropertyIdNameMap>(reserve_num_properties + 1)), shorthand_map(MakeUnique<ShorthandIdNameMap>(reserve_num_shorthands + 1))
{}